

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RobSubstitution.cpp
# Opt level: O3

TermSpec * __thiscall Kernel::RobSubstitution::derefBound(RobSubstitution *this,TermSpec *t_)

{
  Entry *pEVar1;
  TermSpec *pTVar2;
  VarSpec local_28;
  
  do {
    pTVar2 = t_;
    local_28._self._content = (pTVar2->term)._content;
    if ((local_28._self._content & 3) == 0) {
      return pTVar2;
    }
    local_28.index = pTVar2->index;
    pEVar1 = Lib::DHMap<Kernel::VarSpec,_Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>::
             findEntry(&this->_bindings,&local_28);
    t_ = &pEVar1->_val;
  } while (pEVar1 != (Entry *)0x0);
  return pTVar2;
}

Assistant:

TermSpec const& RobSubstitution::derefBound(TermSpec const& t_) const
{
  TermSpec const* t = &t_;
  for(;;) {
    if (t->isTerm()) {
      return *t;
    } else {
      auto binding = _bindings.find(t->varSpec());
      if (!binding) {
        return *t;
      } else {
        t = &binding.unwrap();
      }
    }
  }
}